

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiListClipper::End(ImGuiListClipper *this)

{
  long in_RDI;
  
  if (-1 < *(int *)(in_RDI + 8)) {
    if (*(int *)(in_RDI + 8) < 0x7fffffff) {
      SetCursorPosYAndSetupDummyPrevLine((float)((ulong)in_RDI >> 0x20),(float)in_RDI);
    }
    *(undefined4 *)(in_RDI + 8) = 0xffffffff;
    *(undefined4 *)(in_RDI + 0xc) = 3;
  }
  return;
}

Assistant:

void ImGuiListClipper::End()
{
    if (ItemsCount < 0)
        return;
    // In theory here we should assert that ImGui::GetCursorPosY() == StartPosY + DisplayEnd * ItemsHeight, but it feels saner to just seek at the end and not assert/crash the user.
    if (ItemsCount < INT_MAX)
        SetCursorPosYAndSetupDummyPrevLine(StartPosY + ItemsCount * ItemsHeight, ItemsHeight); // advance cursor
    ItemsCount = -1;
    StepNo = 3;
}